

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_224a1::
ARTIteratorTest_seekThreeLeavesUnderTheRoot_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_seekThreeLeavesUnderTheRoot_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  __extent_storage<18446744073709551615UL> *tree;
  undefined8 uVar1;
  long lVar2;
  iter_difference_t<const_std::byte_*> __d1;
  char *pcVar3;
  char *expected_predicate_value;
  key_view kVar4;
  value_view vVar5;
  value_view v;
  value_view v_00;
  value_view v_01;
  undefined1 local_300 [8];
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  iterator it;
  uint64_t k1;
  uint64_t k0;
  uint64_t k2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  AssertHelper local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  bool local_29 [8];
  bool match;
  
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_300,false);
  k1 = 0xaa10;
  it.keybuf_.off = 0xaa20;
  k0 = 0xaa30;
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0xaa10);
  v._M_extent._M_extent_value = 1;
  v._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_300,kVar4,v,false);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0xaa20);
  v_00._M_extent._M_extent_value = 2;
  v_00._M_ptr = &unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_300,kVar4,v_00,false);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0xaa30);
  expected_predicate_value = (char *)0x0;
  v_01._M_extent._M_extent_value = 3;
  v_01._M_ptr = &unodb::test::test_value_3;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_300,kVar4,v_01,false);
  tree = &verifier.unused_key._M_extent;
  local_29[0] = false;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0xaa10);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar4,local_29,
                   true);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (it.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         it.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)"it.valid()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x225,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl._0_1_ = (internal)local_29[0];
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] == false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)0x21b7a9,"false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x226,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  kVar4 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&k2,"(decode(it.get_key()))","(k0)",(unsigned_long *)&local_50,&k1);
  if ((char)k2 == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x227,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar5 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((vVar5._M_extent._M_extent_value._M_extent_value != 1) || (*vVar5._M_ptr != 0)) {
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x229,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < it.keybuf_.buf) {
    free((void *)it.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&it);
  local_29[0] = false;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0xaa20);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar4,local_29,
                   true);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (it.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         it.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)"it.valid()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x230,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl._0_1_ = (internal)local_29[0];
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] == false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)0x21b7a9,"false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x231,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  kVar4 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&k2,"(decode(it.get_key()))","(k1)",(unsigned_long *)&local_50,
             &it.keybuf_.off);
  if ((char)k2 == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x232,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar5 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (vVar5._M_extent._M_extent_value._M_extent_value == 2) {
    lVar2 = 0;
    do {
      if (vVar5._M_ptr[lVar2] != (&unodb::test::test_value_2)[lVar2]) goto LAB_0017c72d;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 2);
  }
  else {
LAB_0017c72d:
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x234,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < it.keybuf_.buf) {
    free((void *)it.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&it);
  local_29[0] = false;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0xaa30);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar4,local_29,
                   true);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (it.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         it.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)"it.valid()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23b,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl._0_1_ = (internal)local_29[0];
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] == false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)0x21b7a9,"false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23c,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  kVar4 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&k2,"(decode(it.get_key()))","(k2)",(unsigned_long *)&local_50,&k0);
  if ((char)k2 == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar5 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (vVar5._M_extent._M_extent_value._M_extent_value == 3) {
    lVar2 = 0;
    do {
      if (vVar5._M_ptr[lVar2] != (&unodb::test::test_value_3)[lVar2]) goto LAB_0017ca7b;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  else {
LAB_0017ca7b:
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23f,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < it.keybuf_.buf) {
    free((void *)it.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&it);
  local_29[0] = false;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0xaa10);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar4,local_29,
                   false);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (it.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         it.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)"it.valid()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x248,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl._0_1_ = (internal)local_29[0];
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] == false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)0x21b7a9,"false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x249,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  kVar4 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&k2,"(decode(it.get_key()))","(k0)",(unsigned_long *)&local_50,&k1);
  if ((char)k2 == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x24a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar5 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((vVar5._M_extent._M_extent_value._M_extent_value != 1) || (*vVar5._M_ptr != 0)) {
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x24c,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < it.keybuf_.buf) {
    free((void *)it.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&it);
  local_29[0] = false;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0xaa20);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar4,local_29,
                   false);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (it.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         it.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)"it.valid()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x253,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl._0_1_ = (internal)local_29[0];
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] == false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)0x21b7a9,"false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x254,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  kVar4 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&k2,"(decode(it.get_key()))","(k1)",(unsigned_long *)&local_50,
             &it.keybuf_.off);
  if ((char)k2 == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x255,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar5 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (vVar5._M_extent._M_extent_value._M_extent_value == 2) {
    lVar2 = 0;
    do {
      if (vVar5._M_ptr[lVar2] != (&unodb::test::test_value_2)[lVar2]) goto LAB_0017d101;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 2);
  }
  else {
LAB_0017d101:
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,599,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < it.keybuf_.buf) {
    free((void *)it.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&it);
  local_29[0] = false;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0xaa30);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar4,local_29,
                   false);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (it.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         it.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)"it.valid()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x25e,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl._0_1_ = (internal)local_29[0];
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] == false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)0x21b7a9,"false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x25f,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  kVar4 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&k2,"(decode(it.get_key()))","(k2)",(unsigned_long *)&local_50,&k0);
  if ((char)k2 == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x260,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar5 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (vVar5._M_extent._M_extent_value._M_extent_value == 3) {
    lVar2 = 0;
    do {
      if (vVar5._M_ptr[lVar2] != (&unodb::test::test_value_3)[lVar2]) goto LAB_0017d44a;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  else {
LAB_0017d44a:
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x262,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < it.keybuf_.buf) {
    free((void *)it.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&it);
  local_29[0] = true;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar4,local_29,
                   true);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (it.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         it.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)"it.valid()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x271,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_50._M_head_impl._1_7_,local_29[0]) ^ 1);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] != false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)0x21b7a9,"true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x272,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  kVar4 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&k2,"(decode(it.get_key()))","(k0)",(unsigned_long *)&local_50,&k1);
  if ((char)k2 == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x273,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar5 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((vVar5._M_extent._M_extent_value._M_extent_value != 1) || (*vVar5._M_ptr != 0)) {
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x275,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < it.keybuf_.buf) {
    free((void *)it.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&it);
  local_29[0] = true;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0xffff);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar4,local_29,
                   true);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (it.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node ==
         (_Map_pointer)
         it.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)"it.valid()","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x281,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_50._M_head_impl._1_7_,local_29[0]) ^ 1);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] != false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)0x21b7a9,"true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x282,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < it.keybuf_.buf) {
    free((void *)it.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&it);
  local_29[0] = true;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar4,local_29,
                   false);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (it.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node ==
         (_Map_pointer)
         it.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)"it.valid()","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x28f,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_50._M_head_impl._1_7_,local_29[0]) ^ 1);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] != false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)0x21b7a9,"true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x290,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < it.keybuf_.buf) {
    free((void *)it.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&it);
  local_29[0] = true;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_300,0xffff);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar4,local_29,
                   false);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (it.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         it.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)"it.valid()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x29c,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_50._M_head_impl._1_7_,local_29[0]) ^ 1);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] != false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)0x21b7a9,"true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x29d,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  kVar4 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&k2,"(decode(it.get_key()))","(k2)",(unsigned_long *)&local_50,&k0);
  if ((char)k2 == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x29e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar5 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (vVar5._M_extent._M_extent_value._M_extent_value == 3) {
    lVar2 = 0;
    do {
      if (vVar5._M_ptr[lVar2] != (&unodb::test::test_value_3)[lVar2]) goto LAB_0017de7a;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  else {
LAB_0017de7a:
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x2a0,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_50._M_head_impl._0_1_ =
       (internal)
       (it.stack_.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
       (_Map_pointer)
       it.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      it.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&k2,(internal *)&local_50,(AssertionResult *)"it.valid()","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x2a2,(char *)CONCAT71(k2._1_7_,(char)k2));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(k2._1_7_,(char)k2) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(k2._1_7_,(char)k2),local_60._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < it.keybuf_.buf) {
    free((void *)it.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&it);
  if (verifier._232_8_ != 0) {
    operator_delete((void *)verifier._232_8_,
                    (long)verifier.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - verifier._232_8_);
  }
  std::
  _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               *)&verifier.test_db.mutex.super___mutex_base._M_mutex.__data.__list.__next);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::~db((db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         *)tree);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, seekThreeLeavesUnderTheRoot) {
  constexpr bool debug = false;
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();
  constexpr std::uint64_t k0 = 0xaa10;
  constexpr std::uint64_t k1 = 0xaa20;
  constexpr std::uint64_t k2 = 0xaa30;
  verifier.insert(k0, unodb::test::test_values[0]);
  verifier.insert(k1, unodb::test::test_values[1]);
  verifier.insert(k2, unodb::test::test_values[2]);
  if (debug) {
    std::cerr << "db state::\n";
    db.dump(std::cerr);
  }
  {    // exact match, forward traversal
    {  // exact match, forward traversal (GTE), first key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k0)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // exact match, forward traversal (GTE), middle key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k1)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k1);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    }
    {  // exact match, forward traversal (GTE), last key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k2)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
    }
  }
  {    // exact match, reverse traversal
    {  // exact match, reverse traversal (LTE), first key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k0)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // exact match, reverse traversal (LTE), middle key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k1)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k1);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    }
    {  // exact match, reverse traversal (LTE), last key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k2)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
    }
  }
  {    // before and after the first and last key
    {  // forward traversal, before the first key in the data.
      // match=false and iterator is positioned on the first key in the
      // data.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
              true /*fwd*/);
      if (debug) {
        std::cerr << "it.seek(0,&match,true)::\n";
        it.dump(std::cerr);
      }
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_FALSE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // forward traversal, after the last key in the data.
       // match=false and iterator is invalidated.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0xffff)},
              match, true /*fwd*/);
      if (debug) {
        std::cerr << "it.seek(0xffff,&match,true)::\n";
        it.dump(std::cerr);
      }
      UNODB_EXPECT_FALSE(it.valid());
      UNODB_EXPECT_FALSE(match);
    }
    {
      {  // reverse traversal, before the first key in the data.
        // match=false and iterator is invalidated.
        bool match = true;
        auto it = db.test_only_iterator();
        it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)},
                match, false /*fwd*/);
        if (debug) {
          std::cerr << "it.seek(0,&match,true)::\n";
          it.dump(std::cerr);
        }
        UNODB_EXPECT_FALSE(it.valid());
        UNODB_EXPECT_FALSE(match);
      }
      {  // reverse traversal, after the last key in the data.
         // match=false and iterator is positioned at the last key.
        bool match = true;
        auto it = db.test_only_iterator();
        it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0xffff)},
                match, false /*fwd*/);
        if (debug) {
          std::cerr << "it.seek(0xffff,&match,false)::\n";
          it.dump(std::cerr);
        }
        UNODB_EXPECT_TRUE(it.valid());
        UNODB_EXPECT_FALSE(match);
        UNODB_EXPECT_EQ(decode(it.get_key()), k2);
        UNODB_EXPECT_TRUE(
            std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
        it.next();
        UNODB_EXPECT_FALSE(it.valid());
      }
    }
  }
}